

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor * ggml_reshape_2d(ggml_context *ctx,ggml_tensor *a,int ne0,int ne1)

{
  _Bool _Var1;
  ggml_tensor *pgVar2;
  undefined8 uVar3;
  char *pcVar4;
  int ne [2];
  
  _Var1 = ggml_is_contiguous(a);
  if (_Var1) {
    if (a->ne[1] * a->ne[0] * a->ne[2] * a->ne[3] == ne1 * ne0) {
      if (a->grad == (ggml_tensor *)0x0) {
        ne[1] = ne1;
        ne[0] = ne0;
        pgVar2 = ggml_new_tensor_impl(ctx,a->type,2,ne,a->data);
        pgVar2->op = GGML_OP_RESHAPE;
        pgVar2->grad = (ggml_tensor *)0x0;
        pgVar2->src0 = a;
        pgVar2->src1 = (ggml_tensor *)0x0;
        return pgVar2;
      }
      pcVar4 = "false";
      uVar3 = 0xedb;
    }
    else {
      pcVar4 = "ggml_nelements(a) == ne0*ne1";
      uVar3 = 0xed6;
    }
  }
  else {
    pcVar4 = "ggml_is_contiguous(a)";
    uVar3 = 0xed5;
  }
  fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",uVar3,
          pcVar4);
  abort();
}

Assistant:

struct ggml_tensor * ggml_reshape_2d(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int                   ne0,
        int                   ne1) {
    GGML_ASSERT(ggml_is_contiguous(a));
    GGML_ASSERT(ggml_nelements(a) == ne0*ne1);

    bool is_node = false;

    if (a->grad) {
        GGML_ASSERT(false); // TODO: implement backward
        is_node = true;
    }

    const int ne[2] = { ne0, ne1 };
    struct ggml_tensor * result = ggml_new_tensor_impl(ctx, a->type, 2, ne, a->data);

    result->op   = GGML_OP_RESHAPE;
    result->grad = is_node ? ggml_dup_tensor(ctx, result) : NULL;
    result->src0 = a;
    result->src1 = NULL;

    return result;
}